

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink.c
# Opt level: O3

Gia_Man_t * Gia_ManMapShrink4(Gia_Man_t *p,int fKeepLevel,int fVerbose)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *vTruth;
  int *piVar4;
  Vec_Int_t *vVisited;
  Vec_Int_t *vLeavesBest2;
  Gia_Man_t *p_01;
  size_t sVar5;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  Vec_Int_t *pVVar9;
  Gia_Obj_t *pGVar10;
  uint *puVar11;
  Gia_Man_t *pGVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  timespec ts;
  timespec local_50;
  long local_40;
  Gia_Obj_t *local_38;
  
  iVar3 = clock_gettime(3,&local_50);
  if (iVar3 < 0) {
    lVar15 = 1;
  }
  else {
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaShrink.c"
                  ,0x3b,"Gia_Man_t *Gia_ManMapShrink4(Gia_Man_t *, int, int)");
  }
  iVar3 = Gia_ManLutSizeMax(p);
  if (iVar3 < 5) {
    local_40 = lVar15;
    p_00 = (Vec_Int_t *)calloc(1,0x10);
    vTruth = (Vec_Int_t *)malloc(0x10);
    vTruth->nCap = 0x10000;
    vTruth->nSize = 0;
    piVar4 = (int *)malloc(0x40000);
    vTruth->pArray = piVar4;
    vVisited = (Vec_Int_t *)calloc(1,0x10);
    vLeavesBest2 = (Vec_Int_t *)malloc(0x10);
    vLeavesBest2->nCap = 0x10;
    vLeavesBest2->nSize = 0;
    piVar4 = (int *)malloc(0x40);
    vLeavesBest2->pArray = piVar4;
    Dar_LibPrepare(5);
    Gia_ManCleanTruth(p);
    Gia_ManSetPhase(p);
    Gia_ManFillValue(p);
    p->pObjs->Value = 0;
    p_01 = Gia_ManStart(p->nObjs);
    pcVar1 = p->pName;
    if (pcVar1 == (char *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      sVar5 = strlen(pcVar1);
      pcVar6 = (char *)malloc(sVar5 + 1);
      strcpy(pcVar6,pcVar1);
    }
    p_01->pName = pcVar6;
    pcVar1 = p->pSpec;
    if (pcVar1 == (char *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      sVar5 = strlen(pcVar1);
      pcVar6 = (char *)malloc(sVar5 + 1);
      strcpy(pcVar6,pcVar1);
    }
    p_01->pSpec = pcVar6;
    Gia_ManHashAlloc(p_01);
    Gia_ManCleanLevels(p_01,p->nObjs);
    if (1 < p->nObjs) {
      lVar15 = 1;
      do {
        pGVar2 = p->pObjs + lVar15;
        uVar13 = (uint)*(ulong *)pGVar2;
        if ((uVar13 & 0x9fffffff) == 0x9fffffff) {
          pGVar7 = Gia_ManAppendObj(p_01);
          uVar8 = *(ulong *)pGVar7;
          *(ulong *)pGVar7 = uVar8 | 0x9fffffff;
          *(ulong *)pGVar7 =
               uVar8 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar10 = p_01->pObjs;
          if ((pGVar7 < pGVar10) || (pGVar10 + p_01->nObjs <= pGVar7)) {
LAB_0075f58f:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar10) >> 2) * -0x55555555);
          pGVar10 = p_01->pObjs;
          if ((pGVar7 < pGVar10) || (iVar3 = p_01->nObjs, pGVar10 + iVar3 <= pGVar7))
          goto LAB_0075f58f;
          iVar19 = (int)((long)pGVar7 - (long)pGVar10 >> 2);
          uVar20 = iVar19 * -0x55555555;
          uVar13 = iVar19 * 0x55555556;
          pGVar2->Value = uVar13;
          pVVar9 = p->vLevels;
          if (pVVar9 != (Vec_Int_t *)0x0) {
            if ((int)uVar13 < 0) {
LAB_0075f5ec:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf2,"int Abc_Lit2Var(int)");
            }
            if (iVar3 <= (int)(uVar20 & 0x7fffffff)) {
LAB_0075f5ae:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            pGVar7 = p->pObjs;
            if ((pGVar2 < pGVar7) || (pGVar7 + p->nObjs <= pGVar2)) goto LAB_0075f58f;
            uVar13 = (int)((long)pGVar2 - (long)pGVar7 >> 2) * -0x55555555;
            Vec_IntFillExtra(pVVar9,uVar13 + 1,(int)p);
            if (((int)uVar13 < 0) || (pVVar9->nSize <= (int)uVar13)) goto LAB_0075f570;
            pGVar10 = pGVar10 + (uVar20 & 0x7fffffff);
            pGVar2 = p_01->pObjs;
            if ((pGVar10 < pGVar2) || (pGVar2 + p_01->nObjs <= pGVar10)) goto LAB_0075f58f;
            iVar3 = pVVar9->pArray[uVar13 & 0x7fffffff];
            uVar13 = (int)((long)pGVar10 - (long)pGVar2 >> 2) * -0x55555555;
            pVVar9 = p_01->vLevels;
            Vec_IntFillExtra(pVVar9,uVar13 + 1,(int)p_01);
            if (((int)uVar13 < 0) || (pVVar9->nSize <= (int)uVar13)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            pVVar9->pArray[uVar13 & 0x7fffffff] = iVar3;
          }
        }
        else {
          uVar8 = *(ulong *)pGVar2 & 0x1fffffff;
          if (uVar8 == 0x1fffffff || -1 < (int)uVar13) {
            pVVar9 = p->vMapping;
            if (pVVar9->nSize <= lVar15) {
LAB_0075f570:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (pVVar9->pArray[lVar15] != 0) {
              p_00->nSize = 0;
              lVar14 = (long)pVVar9->nSize;
              if (lVar14 <= lVar15) goto LAB_0075f570;
              iVar3 = 4;
              uVar8 = 0;
              while( true ) {
                piVar4 = pVVar9->pArray;
                lVar16 = (long)piVar4[lVar15];
                if ((lVar16 < 0) || ((uint)lVar14 <= (uint)piVar4[lVar15])) goto LAB_0075f570;
                if ((long)piVar4[lVar16] <= (long)uVar8) break;
                Vec_IntPush(p_00,piVar4[lVar16 + uVar8 + 1]);
                uVar8 = uVar8 + 1;
                pVVar9 = p->vMapping;
                lVar14 = (long)pVVar9->nSize;
                iVar3 = iVar3 + -1;
                if (lVar14 <= lVar15) goto LAB_0075f570;
              }
              if (uVar8 < 4) {
                do {
                  Vec_IntPush(p_00,0);
                  iVar3 = iVar3 + -1;
                } while (iVar3 != 0);
              }
              puVar11 = Gia_ManConvertAigToTruth(p,pGVar2,p_00,vTruth,vVisited);
              uVar13 = p_00->nSize;
              uVar8 = (ulong)uVar13;
              if (0 < (int)uVar13) {
                piVar4 = p_00->pArray;
                lVar14 = 0;
                do {
                  uVar13 = (uint)uVar8;
                  iVar3 = piVar4[lVar14];
                  if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_0075f5ae;
                  if (p->pObjs == (Gia_Obj_t *)0x0) break;
                  uVar13 = p->pObjs[iVar3].Value;
                  if (uVar13 == 0xffffffff) {
                    uVar13 = 0;
                  }
                  piVar4[lVar14] = uVar13;
                  lVar14 = lVar14 + 1;
                  uVar13 = p_00->nSize;
                  uVar8 = (ulong)(int)uVar13;
                } while (lVar14 < (long)uVar8);
              }
              uVar20 = 1 << ((char)uVar13 - 5U & 0x1f);
              if ((int)uVar13 < 6) {
                uVar20 = 1;
              }
              uVar18 = (ulong)uVar20;
              uVar8 = uVar18;
              do {
                if ((int)uVar8 < 1) {
                  pGVar2->Value = 0;
                  goto LAB_0075f3b4;
                }
                lVar14 = uVar8 - 1;
                uVar8 = uVar8 - 1;
              } while (puVar11[lVar14] == 0);
              do {
                if ((int)uVar18 < 1) {
                  pGVar2->Value = 1;
                  goto LAB_0075f3b4;
                }
                lVar14 = uVar18 - 1;
                uVar18 = uVar18 - 1;
              } while (puVar11[lVar14] == 0xffffffff);
              uVar13 = Dar_LibEvalBuild(p_01,p_00,(uint)(ushort)*puVar11,fKeepLevel,vLeavesBest2);
              pGVar2->Value = uVar13;
              if ((int)uVar13 < 0) goto LAB_0075f5ec;
              if (p_01->nObjs <= (int)(uVar13 >> 1)) goto LAB_0075f5ae;
              pGVar2->Value =
                   (((uint)(p_01->pObjs + (uVar13 >> 1)) ^ uVar13) & 1 ^
                   (uint)((ulong)*(undefined8 *)
                                  ((ulong)(p_01->pObjs + (uVar13 >> 1)) & 0xfffffffffffffffe) >>
                         0x3f)) != -(int)((long)*(undefined8 *)pGVar2 >> 0x3f) ^ uVar13;
            }
          }
          else {
            uVar20 = pGVar2[-uVar8].Value;
            if ((int)uVar20 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf5,"int Abc_LitNotCond(int, int)");
            }
            uVar21 = uVar20 >> 1;
            if (p_01->nObjs <= (int)uVar21) {
              __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x2ec,"int Gia_ManAppendCo(Gia_Man_t *, int)");
            }
            local_38 = pGVar2;
            if ((~*(uint *)(p_01->pObjs + uVar21) & 0x1fffffff) != 0 &&
                (int)*(uint *)(p_01->pObjs + uVar21) < 0) {
              __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x2ed,"int Gia_ManAppendCo(Gia_Man_t *, int)");
            }
            pGVar10 = Gia_ManAppendObj(p_01);
            uVar8 = *(ulong *)pGVar10;
            *(ulong *)pGVar10 = uVar8 | 0x80000000;
            pGVar2 = p_01->pObjs;
            if ((pGVar10 < pGVar2) || (pGVar2 + p_01->nObjs <= pGVar10)) goto LAB_0075f58f;
            uVar18 = (ulong)(((uint)((int)pGVar10 - (int)pGVar2) >> 2) * -0x55555555 - uVar21 &
                            0x1fffffff);
            uVar17 = (ulong)((uVar20 << 0x1d ^ uVar13) & 0x20000000);
            *(ulong *)pGVar10 = uVar17 | uVar8 & 0xffffffffc0000000 | 0x80000000 | uVar18;
            *(ulong *)pGVar10 =
                 uVar17 | uVar8 & 0xe0000000c0000000 | 0x80000000 | uVar18 |
                 (ulong)(p_01->vCos->nSize & 0x1fffffff) << 0x20;
            pGVar2 = p_01->pObjs;
            if ((pGVar10 < pGVar2) || (pGVar2 + p_01->nObjs <= pGVar10)) goto LAB_0075f58f;
            Vec_IntPush(p_01->vCos,(int)((ulong)((long)pGVar10 - (long)pGVar2) >> 2) * -0x55555555);
            if (p_01->pFanData != (int *)0x0) {
              Gia_ObjAddFanout(p_01,pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff),
                               pGVar10);
            }
            pGVar2 = p_01->pObjs;
            if ((pGVar10 < pGVar2) || (pGVar2 + p_01->nObjs <= pGVar10)) goto LAB_0075f58f;
            local_38->Value = (int)((ulong)((long)pGVar10 - (long)pGVar2) >> 2) * 0x55555556;
          }
        }
LAB_0075f3b4:
        lVar15 = lVar15 + 1;
      } while (lVar15 < p->nObjs);
    }
    Gia_ManHashStop(p_01);
    iVar3 = Gia_ManHasDangling(p_01);
    if (iVar3 != 0) {
      pGVar12 = Gia_ManCleanup(p_01);
      if ((fVerbose != 0) &&
         (~(pGVar12->vCos->nSize + pGVar12->vCis->nSize) + pGVar12->nObjs !=
          ~(p_01->vCos->nSize + p_01->vCis->nSize) + p_01->nObjs)) {
        printf("Gia_ManMapShrink4() node reduction after sweep %6d -> %6d.\n");
      }
      Gia_ManStop(p_01);
      p_01 = pGVar12;
    }
    Gia_ManSetRegNum(p_01,p->nRegs);
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
    }
    free(p_00);
    if (vTruth->pArray != (int *)0x0) {
      free(vTruth->pArray);
    }
    free(vTruth);
    if (vVisited->pArray != (int *)0x0) {
      free(vVisited->pArray);
    }
    free(vVisited);
    if (vLeavesBest2->pArray != (int *)0x0) {
      free(vLeavesBest2->pArray);
    }
    free(vLeavesBest2);
    if (fVerbose != 0) {
      iVar3 = 0x8730f2;
      printf("Total gain in AIG nodes = %d.  ",(ulong)(uint)(p->nObjs - p_01->nObjs));
      Abc_Print(iVar3,"%s =","Total runtime");
      iVar19 = 3;
      iVar3 = clock_gettime(3,&local_50);
      if (iVar3 < 0) {
        lVar15 = -1;
      }
      else {
        lVar15 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
      }
      Abc_Print(iVar19,"%9.2f sec\n",(double)(lVar15 + local_40) / 1000000.0);
    }
  }
  else {
    puts("Resynthesis is not performed when nodes have more than 4 inputs.");
    p_01 = (Gia_Man_t *)0x0;
  }
  return p_01;
}

Assistant:

Gia_Man_t * Gia_ManMapShrink4( Gia_Man_t * p, int fKeepLevel, int fVerbose )
{
    Vec_Int_t * vLeaves, * vTruth, * vVisited, * vLeavesBest;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pFanin;
    unsigned * pTruth;
    int i, k, iFan;
    abctime clk = Abc_Clock();
//    int ClassCounts[222] = {0};
    int * pLutClass, Counter = 0;
    assert( Gia_ManHasMapping(p) );
    if ( Gia_ManLutSizeMax( p ) > 4 )
    {
        printf( "Resynthesis is not performed when nodes have more than 4 inputs.\n" );
        return NULL;
    }
    pLutClass   = ABC_CALLOC( int, Gia_ManObjNum(p) );
    vLeaves     = Vec_IntAlloc( 0 );
    vTruth      = Vec_IntAlloc( (1<<16) );
    vVisited    = Vec_IntAlloc( 0 );
    vLeavesBest = Vec_IntAlloc( 4 );
    // prepare the library
    Dar_LibPrepare( 5 ); 
    // clean the old manager
    Gia_ManCleanTruth( p );
    Gia_ManSetPhase( p );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    // start the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManCleanLevels( pNew, Gia_ManObjNum(p) );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
        {
            pObj->Value = Gia_ManAppendCi( pNew );
            if ( p->vLevels )
                Gia_ObjSetLevel( pNew, Gia_ObjFromLit(pNew, Gia_ObjValue(pObj)), Gia_ObjLevel(p, pObj) );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        }
        else if ( Gia_ObjIsLut(p, i) )
        {
            Counter++;
            // collect leaves of this gate
            Vec_IntClear( vLeaves );
            Gia_LutForEachFanin( p, i, iFan, k )
                Vec_IntPush( vLeaves, iFan );
            for ( ; k < 4; k++ )
                Vec_IntPush( vLeaves, 0 );
            //.compute the truth table 
            pTruth = Gia_ManConvertAigToTruth( p, pObj, vLeaves, vTruth, vVisited );
            // change from node IDs to their literals
            Gia_ManForEachObjVec( vLeaves, p, pFanin, k )
            {
//                assert( Gia_ObjValue(pFanin) != ~0 ); 
                Vec_IntWriteEntry( vLeaves, k, Gia_ObjValue(pFanin) != ~0 ? Gia_ObjValue(pFanin) : 0 );
            }
            // derive new structre
            if ( Gia_ManTruthIsConst0(pTruth, Vec_IntSize(vLeaves)) )
                pObj->Value = 0;
            else if ( Gia_ManTruthIsConst1(pTruth, Vec_IntSize(vLeaves)) )
                pObj->Value = 1;
            else
            {
                pObj->Value = Dar_LibEvalBuild( pNew, vLeaves, 0xffff & *pTruth, fKeepLevel, vLeavesBest );
                pObj->Value = Abc_LitNotCond( pObj->Value, Gia_ObjPhaseRealLit(pNew, pObj->Value) ^ pObj->fPhase );
            }
        }
    }
    // cleanup the AIG
    Gia_ManHashStop( pNew );
    // check the presence of dangling nodes
    if ( Gia_ManHasDangling(pNew) )
    {
        pNew = Gia_ManCleanup( pTemp = pNew );
        if ( fVerbose && Gia_ManAndNum(pNew) != Gia_ManAndNum(pTemp) )
            printf( "Gia_ManMapShrink4() node reduction after sweep %6d -> %6d.\n", Gia_ManAndNum(pTemp), Gia_ManAndNum(pNew) );
        Gia_ManStop( pTemp );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vTruth );
    Vec_IntFree( vVisited );
    Vec_IntFree( vLeavesBest );
    if ( fVerbose )
    {
        printf( "Total gain in AIG nodes = %d.  ", Gia_ManObjNum(p)-Gia_ManObjNum(pNew) );
        ABC_PRT( "Total runtime", Abc_Clock() - clk );
    }
    ABC_FREE( pLutClass );
    return pNew;
}